

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ResamplerModel.cpp
# Opt level: O2

void SRCTools::ResamplerModel::freeResamplerModel
               (FloatSampleProvider *model,FloatSampleProvider *source)

{
  FloatSampleProvider *pFVar1;
  long lVar2;
  
  while ((model != source && (model != (FloatSampleProvider *)0x0))) {
    lVar2 = __dynamic_cast(model,&FloatSampleProvider::typeinfo,&CascadeStage::typeinfo,0);
    if (lVar2 == 0) {
      return;
    }
    pFVar1 = *(FloatSampleProvider **)(lVar2 + 0x10);
    (*model->_vptr_FloatSampleProvider[1])(model);
    model = pFVar1;
  }
  return;
}

Assistant:

void ResamplerModel::freeResamplerModel(FloatSampleProvider &model, FloatSampleProvider &source) {
	FloatSampleProvider *currentStage = &model;
	while (currentStage != &source) {
		CascadeStage *cascadeStage = dynamic_cast<CascadeStage *>(currentStage);
		if (cascadeStage == NULL) return;
		FloatSampleProvider &prevStage = cascadeStage->source;
		delete currentStage;
		currentStage = &prevStage;
	}
}